

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall TcpServerImpl::SelectThread(TcpServerImpl *this)

{
  int *piVar1;
  uint __i;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  int *piVar5;
  int iVar6;
  bool bVar7;
  atomic<unsigned_int> nNewConCbCount;
  socklen_t addLen;
  undefined4 uStack_184;
  int32_t fdClient;
  vector<int,_std::allocator<int>_> vSockets;
  timeval local_148;
  fd_set readfd;
  sockaddr_storage addrCl;
  
  nNewConCbCount.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0;
  do {
    do {
      if ((this->super_BaseSocketImpl).m_bStop != false) {
        while (nNewConCbCount.super___atomic_base<unsigned_int>._M_i != 0) {
          readfd.fds_bits[0] = 1;
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                    ((duration<long,_std::ratio<1L,_1000L>_> *)&readfd);
        }
        Delete(this);
        return;
      }
      readfd.fds_bits[0xe] = 0;
      readfd.fds_bits[0xf] = 0;
      readfd.fds_bits[0xc] = 0;
      readfd.fds_bits[0xd] = 0;
      readfd.fds_bits[10] = 0;
      readfd.fds_bits[0xb] = 0;
      readfd.fds_bits[8] = 0;
      readfd.fds_bits[9] = 0;
      readfd.fds_bits[6] = 0;
      readfd.fds_bits[7] = 0;
      readfd.fds_bits[4] = 0;
      readfd.fds_bits[5] = 0;
      readfd.fds_bits[2] = 0;
      readfd.fds_bits[3] = 0;
      readfd.fds_bits[0] = 0;
      readfd.fds_bits[1] = 0;
      local_148.tv_sec = 2;
      local_148.tv_usec = 0;
      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
        readfd.fds_bits[lVar3] = 0;
      }
      piVar1 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar2 = 0;
      for (piVar5 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar5 != piVar1; piVar5 = piVar5 + 1) {
        iVar6 = *piVar5;
        readfd.fds_bits[iVar6 / 0x40] = readfd.fds_bits[iVar6 / 0x40] | 1L << ((byte)iVar6 & 0x3f);
        if (iVar2 < iVar6) {
          iVar2 = iVar6;
        }
      }
      iVar2 = select(iVar2 + 1,(fd_set *)&readfd,(fd_set *)0x0,(fd_set *)0x0,&local_148);
    } while (iVar2 < 1);
    vSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    vSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    piVar1 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar5 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar5 != piVar1; piVar5 = piVar5 + 1) {
      iVar2 = *piVar5;
      if (((ulong)readfd.fds_bits[iVar2 / 0x40] >> ((long)iVar2 % 0x40 & 0x3fU) & 1) != 0) {
        iVar6 = 0x10;
        while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
          addLen = 0x80;
          fdClient = accept(iVar2,(sockaddr *)&addrCl,(socklen_t *)&addLen);
          if (fdClient == -1) break;
          std::vector<int,_std::allocator<int>_>::push_back(&vSockets,&fdClient);
        }
      }
    }
    if ((vSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish !=
         vSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start) && ((this->super_BaseSocketImpl).m_bStop == false)) {
      LOCK();
      nNewConCbCount.super___atomic_base<unsigned_int>._M_i =
           (__atomic_base<unsigned_int>)
           ((int)nNewConCbCount.super___atomic_base<unsigned_int>._M_i + 1);
      UNLOCK();
      _addLen = (id)0;
      puVar4 = (undefined8 *)operator_new(0x30);
      *puVar4 = &PTR___State_impl_00146808;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)(puVar4 + 1),&vSockets);
      puVar4[4] = this;
      puVar4[5] = &nNewConCbCount;
      addrCl._0_8_ = puVar4;
      std::thread::_M_start_thread((thread *)&addLen,&addrCl,0);
      if (addrCl._0_8_ != 0) {
        (**(code **)(*(long *)addrCl._0_8_ + 8))();
      }
      std::thread::detach();
      std::thread::~thread((thread *)&addLen);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&vSockets.super__Vector_base<int,_std::allocator<int>_>);
  } while( true );
}

Assistant:

void TcpServerImpl::SelectThread()
{
    atomic<uint32_t> nNewConCbCount(0);

    while (m_bStop == false)
    {
        fd_set readfd{};
        struct timeval timeout{};
        SOCKET maxFd = 0;

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&readfd);

        for (auto Sock : m_vSock)
        {
            FD_SET(Sock, &readfd);
            if (Sock > maxFd)
                maxFd = Sock;
        }

        const int iRes = ::select(static_cast<int>(maxFd + 1), &readfd, nullptr, nullptr, &timeout);
        if (iRes > 0)
        {
            vector<SOCKET> vSockets;

            for (auto Sock : m_vSock)
            {
                if (FD_ISSET(Sock, &readfd))
                {
                    for (int n = 0; n < 16; ++n)                // The ACCEPT_QUEUE is an optimization mechanism that allows the server to
                    {                                           // accept() up to this many connections before serving any of them.  The
                        struct sockaddr_storage addrCl;         // reason is that the timeout waiting for the accept() is much shorter
                        socklen_t addLen = sizeof(addrCl);      // than the timeout for the actual processing.

                        const SOCKET fdClient = ::accept(Sock, reinterpret_cast<struct sockaddr*>(&addrCl), &addLen);
                        if (fdClient == INVALID_SOCKET)
                            break;

                        vSockets.push_back(fdClient);
                    }
                }
            }

            if (vSockets.size() > 0 && m_bStop == false)
            {
                nNewConCbCount++;

                thread([this, &nNewConCbCount](const vector<SOCKET> vNewSockets)
                {
                    vector<TcpSocket*> vNewConnections;
                    for (const SOCKET sock : vNewSockets)
                    {
                        TcpSocket* pClient = MakeClientConnection(sock);
                        if (pClient == nullptr)
                            continue;
                        if (pClient->GetErrorNo() != 0)
                        {
                            if (m_fErrorParam)
                                m_fErrorParam(pClient, m_pvUserData);  // Must call Close() in the error callback
                            else if (m_fError)
                                m_fError(pClient);  // Must call Close() in the error callback
                            else
                                pClient->Close();
                            continue;
                        }
                        vNewConnections.push_back(pClient);
                    }
                    if (m_fNewConnectionParam != nullptr && m_bStop != true)
                        m_fNewConnectionParam(vNewConnections, m_pvUserData);
                    else if (m_fNewConnection != nullptr && m_bStop != true)
                        m_fNewConnection(vNewConnections);
                    else
                    {
                        for (auto pClient : vNewConnections)
                            pClient->Close();
                    }
                    nNewConCbCount--;
                }, vSockets).detach();
            }
        }
    }

    while (nNewConCbCount != 0)
        this_thread::sleep_for(chrono::milliseconds(1));

    Delete();
}